

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

void overlap_remove(bam_plp_t iter,bam1_t *b)

{
  int *piVar1;
  uint uVar2;
  uint8_t *__s2;
  lbnode_t *plVar3;
  uint8_t uVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  uint8_t *puVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  
  if (iter != (bam_plp_t)0x0) {
    if (b == (bam1_t *)0x0) {
      uVar9 = *(uint *)&iter->mp;
      if (uVar9 != 0) {
        plVar3 = iter->tail;
        uVar12 = 0;
        uVar10 = 0;
        do {
          uVar2 = (&(plVar3->b).core.tid)[uVar10 >> 4];
          if ((uVar2 >> (sbyte)(uVar12 & 0x1e) & 3) == 0) {
            (&(plVar3->b).core.tid)[uVar10 >> 4] = uVar2 | 1 << (uVar12 & 0x1e);
            piVar1 = (int *)((long)&iter->mp + 4);
            *piVar1 = *piVar1 + -1;
            uVar9 = *(uint *)&iter->mp;
          }
          uVar10 = uVar10 + 1;
          uVar12 = uVar12 + 2;
        } while (uVar10 < uVar9);
      }
    }
    else {
      uVar9 = *(uint *)&iter->mp;
      if (uVar9 == 0) {
        uVar12 = 0;
LAB_0013ead7:
        if (uVar12 != uVar9) {
          uVar9 = (&(iter->tail->b).core.tid)[uVar12 >> 4];
          uVar10 = uVar12 * 2 & 0x1e;
          if ((uVar9 >> (sbyte)uVar10 & 3) == 0) {
            (&(iter->tail->b).core.tid)[uVar12 >> 4] = uVar9 | 1 << uVar10;
            piVar1 = (int *)((long)&iter->mp + 4);
            *piVar1 = *piVar1 + -1;
          }
        }
      }
      else {
        __s2 = b->data;
        uVar10 = (uint)(char)*__s2;
        if (*__s2 == '\0') {
          uVar10 = 0;
        }
        else {
          uVar4 = __s2[1];
          if (uVar4 != '\0') {
            puVar8 = __s2 + 2;
            do {
              uVar10 = (int)(char)uVar4 + uVar10 * 0x1f;
              uVar4 = *puVar8;
              puVar8 = puVar8 + 1;
            } while (uVar4 != '\0');
          }
        }
        uVar10 = uVar10 & uVar9 - 1;
        plVar3 = iter->tail;
        iVar11 = 1;
        uVar12 = uVar10;
        do {
          uVar2 = (&(plVar3->b).core.tid)[uVar12 >> 4];
          bVar7 = (char)uVar12 * '\x02' & 0x1e;
          uVar5 = uVar2 >> bVar7;
          if (((uVar5 & 2) != 0) ||
             (((uVar5 & 1) == 0 &&
              (iVar6 = strcmp(*(char **)(&(iter->dummy->b).core.tid + (ulong)uVar12 * 2),
                              (char *)__s2), iVar6 == 0)))) {
            if ((uVar2 >> bVar7 & 3) != 0) {
              uVar12 = uVar9;
            }
            goto LAB_0013ead7;
          }
          uVar12 = uVar12 + iVar11 & uVar9 - 1;
          iVar11 = iVar11 + 1;
        } while (uVar12 != uVar10);
      }
    }
  }
  return;
}

Assistant:

static void overlap_remove(bam_plp_t iter, const bam1_t *b)
{
    if ( !iter->overlaps ) return;

    khiter_t kitr;
    if ( b )
    {
        kitr = kh_get(olap_hash, iter->overlaps, bam_get_qname(b));
        if ( kitr!=kh_end(iter->overlaps) )
            kh_del(olap_hash, iter->overlaps, kitr);
    }
    else
    {
        // remove all
        for (kitr = kh_begin(iter->overlaps); kitr<kh_end(iter->overlaps); kitr++)
            if ( kh_exist(iter->overlaps, kitr) ) kh_del(olap_hash, iter->overlaps, kitr);
    }
}